

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int verify_miniscript_and_v(miniscript_node_t *node,miniscript_node_t *parent)

{
  int iVar1;
  uint32_t uVar2;
  
  iVar1 = verify_miniscript_two_param_check(node,parent);
  if (iVar1 == 0) {
    uVar2 = verify_miniscript_and_v_property
                      (node->child->type_properties,node->child->next->type_properties);
    node->type_properties = uVar2;
    iVar1 = (uint)(uVar2 != 0) * 2 + -2;
  }
  return iVar1;
}

Assistant:

static int verify_miniscript_and_v(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    int ret = verify_miniscript_two_param_check(node, parent);
    if (ret == WALLY_OK) {
        node->type_properties = verify_miniscript_and_v_property(
            node->child->type_properties,
            node->child->next->type_properties);
        if (!node->type_properties)
            ret = WALLY_EINVAL;
    }
    return ret;
}